

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void http_request_cb(evhttp_request *req,void *arg)

{
  _Invoker_type *__rhs;
  long lVar1;
  string_view source_file;
  pointer pCVar2;
  pointer pHVar3;
  bool bVar4;
  __type_conflict _Var5;
  uint uVar6;
  RequestMethod RVar7;
  long lVar8;
  Logger *pLVar9;
  __uniq_ptr_data<HTTPWorkItem,_std::default_delete<HTTPWorkItem>,_true,_true> this;
  int nStatus;
  CSubNet *subnet;
  pointer this_00;
  HTTPRequestHandler *_func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  span<const_std::byte,_18446744073709551615UL> reply;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  char *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_> local_1c0;
  __single_object hreq;
  evhttp_request *req_local;
  string local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string strURI;
  UniqueLock<GlobalMutex> criticalblock12;
  unique_ptr<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_> item;
  string path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  req_local = req;
  lVar8 = evhttp_request_get_connection();
  HTTPRequestTracker::AddRequest(&g_requests,req);
  evhttp_request_set_on_complete_cb(req,http_request_cb::anon_class_1_0_00000001::__invoke,0);
  evhttp_connection_set_closecb(lVar8,http_request_cb::anon_class_1_0_00000001::__invoke,0);
  uVar6 = event_get_version_number();
  if (((0x20105ff < uVar6) && (uVar6 = event_get_version_number(), lVar8 != 0 && uVar6 < 0x2010900))
     && (lVar8 = evhttp_connection_get_bufferevent(lVar8), lVar8 != 0)) {
    bufferevent_disable(lVar8,2);
  }
  std::make_unique<HTTPRequest,evhttp_request*&,util::SignalInterrupt_const&>
            ((evhttp_request **)&hreq,(SignalInterrupt *)&req_local);
  HTTPRequest::GetPeer
            ((CService *)&strURI,
             (HTTPRequest *)
             hreq._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
             super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
             super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl);
  bVar4 = CNetAddr::IsValid((CNetAddr *)&strURI);
  pCVar2 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (bVar4) {
    this_00 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (this_00 == pCVar2) goto LAB_006cca7a;
      bVar4 = CSubNet::Match(this_00,(CNetAddr *)&strURI);
      this_00 = this_00 + 1;
    } while (!bVar4);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&strURI);
    RVar7 = HTTPRequest::GetRequestMethod
                      ((HTTPRequest *)
                       hreq._M_t.
                       super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
                       super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                       super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl);
    if (RVar7 != UNKNOWN) {
      bVar4 = LogAcceptCategory(HTTP,Debug);
      if (bVar4) {
        RVar7 = HTTPRequest::GetRequestMethod
                          ((HTTPRequest *)
                           hreq._M_t.
                           super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                           super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl);
        RequestMethodString_abi_cxx11_(&local_120,RVar7);
        HTTPRequest::GetURI_abi_cxx11_
                  (&local_180,
                   (HTTPRequest *)
                   hreq._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>.
                   _M_t.super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                   super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl);
        str._M_str = local_180._M_dataplus._M_p;
        str._M_len = local_180._M_string_length;
        SanitizeString_abi_cxx11_(&local_160,str,3);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_140,&local_160,0,100);
        HTTPRequest::GetPeer
                  ((CService *)&strURI,
                   (HTTPRequest *)
                   hreq._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>.
                   _M_t.super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                   super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl);
        CService::ToStringAddrPort_abi_cxx11_(&local_1a0,(CService *)&strURI);
        pLVar9 = LogInstance();
        bVar4 = BCLog::Logger::Enabled(pLVar9);
        if (bVar4) {
          path._M_dataplus._M_p = (pointer)&path.field_2;
          path._M_string_length = 0;
          path.field_2._M_local_buf[0] = '\0';
          tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((string *)&item,(tinyformat *)"Received a %s request for %s from %s\n",
                     (char *)&local_120,&local_140,&local_1a0,in_R9);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &item);
          std::__cxx11::string::~string((string *)&item);
          pLVar9 = LogInstance();
          item._M_t.super___uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>._M_t.
          super__Tuple_impl<0UL,_HTTPWorkItem_*,_std::default_delete<HTTPWorkItem>_>.
          super__Head_base<0UL,_HTTPWorkItem_*,_false>._M_head_impl =
               (__uniq_ptr_data<HTTPWorkItem,_std::default_delete<HTTPWorkItem>,_true,_true>)
               (__uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>)0x57;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
          ;
          source_file._M_len = 0x57;
          str_00._M_str = path._M_dataplus._M_p;
          str_00._M_len = path._M_string_length;
          logging_function_02._M_str = "http_request_cb";
          logging_function_02._M_len = 0xf;
          BCLog::Logger::LogPrintStr(pLVar9,str_00,logging_function_02,source_file,0x131,HTTP,Debug)
          ;
          std::__cxx11::string::~string((string *)&path);
        }
        std::__cxx11::string::~string((string *)&local_1a0);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&strURI);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_120);
      }
      HTTPRequest::GetURI_abi_cxx11_
                (&strURI,(HTTPRequest *)
                         hreq._M_t.
                         super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
                         super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                         super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl);
      path._M_dataplus._M_p = (pointer)&path.field_2;
      path._M_string_length = 0;
      path.field_2._M_local_buf[0] = '\0';
      UniqueLock<GlobalMutex>::UniqueLock
                (&criticalblock12,&g_httppathhandlers_mutex,"g_httppathhandlers_mutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                 ,0x136,false);
      pHVar3 = pathHandlers.super__Vector_base<HTTPPathHandler,_std::allocator<HTTPPathHandler>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (_func = &(pathHandlers.
                     super__Vector_base<HTTPPathHandler,_std::allocator<HTTPPathHandler>_>._M_impl.
                     super__Vector_impl_data._M_start)->handler; __rhs = &_func[-2]._M_invoker,
          (pointer)__rhs != pHVar3;
          _func = (HTTPRequestHandler *)((long)&_func[2].super__Function_base._M_functor + 8)) {
        if (*(char *)&_func[-1]._M_invoker == '\x01') {
          _Var5 = std::operator==(&strURI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__rhs);
          if (_Var5) {
LAB_006ccbdb:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item,
                       &strURI,*(size_type *)&_func[-1].super__Function_base._M_functor,
                       0xffffffffffffffff);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &item);
            std::__cxx11::string::~string((string *)&item);
            this.super___uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>._M_t.
            super__Tuple_impl<0UL,_HTTPWorkItem_*,_std::default_delete<HTTPWorkItem>_>.
            super__Head_base<0UL,_HTTPWorkItem_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>)
                 operator_new(0x50);
            local_1c0._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>.
            _M_t.super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
            super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl =
                 hreq._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>.
                 _M_t.super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                 super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl;
            hreq._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
            super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
            super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl =
                 (__uniq_ptr_data<HTTPRequest,_std::default_delete<HTTPRequest>,_true,_true>)
                 (__uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>)0x0;
            HTTPWorkItem::HTTPWorkItem
                      ((HTTPWorkItem *)
                       this.super___uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_HTTPWorkItem_*,_std::default_delete<HTTPWorkItem>_>.
                       super__Head_base<0UL,_HTTPWorkItem_*,_false>._M_head_impl,
                       (unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_>)&local_1c0,&path,
                       _func);
            item._M_t.super___uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>._M_t.
            super__Tuple_impl<0UL,_HTTPWorkItem_*,_std::default_delete<HTTPWorkItem>_>.
            super__Head_base<0UL,_HTTPWorkItem_*,_false>._M_head_impl =
                 (__uniq_ptr_data<HTTPWorkItem,_std::default_delete<HTTPWorkItem>,_true,_true>)
                 (__uniq_ptr_data<HTTPWorkItem,_std::default_delete<HTTPWorkItem>,_true,_true>)
                 this.super___uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>._M_t.
                 super__Tuple_impl<0UL,_HTTPWorkItem_*,_std::default_delete<HTTPWorkItem>_>.
                 super__Head_base<0UL,_HTTPWorkItem_*,_false>._M_head_impl;
            std::unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_>::~unique_ptr(&local_1c0)
            ;
            if ((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                 )g_work_queue._M_t.
                  super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                  .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                 )0x0) {
              __assert_fail("g_work_queue",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                            ,0x148,"void http_request_cb(struct evhttp_request *, void *)");
            }
            bVar4 = WorkQueue<HTTPClosure>::Enqueue
                              ((WorkQueue<HTTPClosure> *)
                               g_work_queue._M_t.
                               super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                               .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl,
                               (HTTPClosure *)
                               this.
                               super___uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HTTPWorkItem_*,_std::default_delete<HTTPWorkItem>_>
                               .super__Head_base<0UL,_HTTPWorkItem_*,_false>._M_head_impl);
            if (bVar4) {
              item._M_t.super___uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>._M_t
              .super__Tuple_impl<0UL,_HTTPWorkItem_*,_std::default_delete<HTTPWorkItem>_>.
              super__Head_base<0UL,_HTTPWorkItem_*,_false>._M_head_impl =
                   (__uniq_ptr_data<HTTPWorkItem,_std::default_delete<HTTPWorkItem>,_true,_true>)
                   (__uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>)0x0;
            }
            else {
              source_file_02._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
              ;
              source_file_02._M_len = 0x57;
              logging_function_01._M_str = "http_request_cb";
              logging_function_01._M_len = 0xf;
              LogPrintf_<>(logging_function_01,source_file_02,0x14c,ALL,Info,
                           "WARNING: request rejected because http work queue depth exceeded, it can be increased with the -rpcworkqueue= setting\n"
                          );
              reply._M_extent._M_extent_value = 0x19;
              reply._M_ptr = (pointer)"Work queue depth exceeded";
              HTTPRequest::WriteReply
                        (*(HTTPRequest **)
                          ((long)item._M_t.
                                 super___uniq_ptr_impl<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HTTPWorkItem_*,_std::default_delete<HTTPWorkItem>_>
                                 .super__Head_base<0UL,_HTTPWorkItem_*,_false>._M_head_impl + 8),
                         0x1f7,reply);
            }
            std::unique_ptr<HTTPWorkItem,_std::default_delete<HTTPWorkItem>_>::~unique_ptr(&item);
            goto LAB_006ccce4;
          }
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item,
                     &strURI,0,*(size_type *)&_func[-1].super__Function_base._M_functor);
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&item,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)__rhs);
          std::__cxx11::string::~string((string *)&item);
          if (_Var5) goto LAB_006ccbdb;
        }
      }
      HTTPRequest::WriteReply
                ((HTTPRequest *)
                 hreq._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>.
                 _M_t.super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                 super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl,0x194,
                 (span<const_std::byte,_18446744073709551615UL>)ZEXT816(0xc7f1cc));
LAB_006ccce4:
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock12.super_unique_lock);
      std::__cxx11::string::~string((string *)&path);
      std::__cxx11::string::~string((string *)&strURI);
      goto LAB_006ccb1e;
    }
    bVar4 = LogAcceptCategory(HTTP,Debug);
    nStatus = 0x195;
    if (bVar4) {
      HTTPRequest::GetPeer
                ((CService *)&strURI,
                 (HTTPRequest *)
                 hreq._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>.
                 _M_t.super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                 super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl);
      CService::ToStringAddrPort_abi_cxx11_(&path,(CService *)&strURI);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_01._M_len = 0x57;
      logging_function_00._M_str = "http_request_cb";
      logging_function_00._M_len = 0xf;
      LogPrintf_<std::__cxx11::string>
                (logging_function_00,source_file_01,299,
                 IPC|I2P|QT|LIBEVENT|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|RPC|MEMPOOL|TOR,
                 (Level)&path,in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
      nStatus = 0x195;
      goto LAB_006ccaef;
    }
  }
  else {
LAB_006cca7a:
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&strURI);
    bVar4 = LogAcceptCategory(HTTP,Debug);
    nStatus = 0x193;
    if (bVar4) {
      HTTPRequest::GetPeer
                ((CService *)&strURI,
                 (HTTPRequest *)
                 hreq._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>.
                 _M_t.super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                 super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl);
      CService::ToStringAddrPort_abi_cxx11_(&path,(CService *)&strURI);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_00._M_len = 0x57;
      logging_function._M_str = "http_request_cb";
      logging_function._M_len = 0xf;
      LogPrintf_<std::__cxx11::string>
                (logging_function,source_file_00,0x123,
                 IPC|I2P|QT|LIBEVENT|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ZMQ|BENCH|HTTP|MEMPOOL|NET,
                 (Level)&path,in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
      nStatus = 0x193;
LAB_006ccaef:
      std::__cxx11::string::~string((string *)&path);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&strURI);
    }
  }
  HTTPRequest::WriteReply
            ((HTTPRequest *)
             hreq._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
             super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
             super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl,nStatus,
             (span<const_std::byte,_18446744073709551615UL>)ZEXT816(0xc7f1cc));
LAB_006ccb1e:
  std::unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_>::~unique_ptr(&hreq);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void http_request_cb(struct evhttp_request* req, void* arg)
{
    evhttp_connection* conn{evhttp_request_get_connection(req)};
    // Track active requests
    {
        g_requests.AddRequest(req);
        evhttp_request_set_on_complete_cb(req, [](struct evhttp_request* req, void*) {
            g_requests.RemoveRequest(req);
        }, nullptr);
        evhttp_connection_set_closecb(conn, [](evhttp_connection* conn, void* arg) {
            g_requests.RemoveConnection(conn);
        }, nullptr);
    }

    // Disable reading to work around a libevent bug, fixed in 2.1.9
    // See https://github.com/libevent/libevent/commit/5ff8eb26371c4dc56f384b2de35bea2d87814779
    // and https://github.com/bitcoin/bitcoin/pull/11593.
    if (event_get_version_number() >= 0x02010600 && event_get_version_number() < 0x02010900) {
        if (conn) {
            bufferevent* bev = evhttp_connection_get_bufferevent(conn);
            if (bev) {
                bufferevent_disable(bev, EV_READ);
            }
        }
    }
    auto hreq{std::make_unique<HTTPRequest>(req, *static_cast<const util::SignalInterrupt*>(arg))};

    // Early address-based allow check
    if (!ClientAllowed(hreq->GetPeer())) {
        LogDebug(BCLog::HTTP, "HTTP request from %s rejected: Client network is not allowed RPC access\n",
                 hreq->GetPeer().ToStringAddrPort());
        hreq->WriteReply(HTTP_FORBIDDEN);
        return;
    }

    // Early reject unknown HTTP methods
    if (hreq->GetRequestMethod() == HTTPRequest::UNKNOWN) {
        LogDebug(BCLog::HTTP, "HTTP request from %s rejected: Unknown HTTP request method\n",
                 hreq->GetPeer().ToStringAddrPort());
        hreq->WriteReply(HTTP_BAD_METHOD);
        return;
    }

    LogDebug(BCLog::HTTP, "Received a %s request for %s from %s\n",
             RequestMethodString(hreq->GetRequestMethod()), SanitizeString(hreq->GetURI(), SAFE_CHARS_URI).substr(0, 100), hreq->GetPeer().ToStringAddrPort());

    // Find registered handler for prefix
    std::string strURI = hreq->GetURI();
    std::string path;
    LOCK(g_httppathhandlers_mutex);
    std::vector<HTTPPathHandler>::const_iterator i = pathHandlers.begin();
    std::vector<HTTPPathHandler>::const_iterator iend = pathHandlers.end();
    for (; i != iend; ++i) {
        bool match = false;
        if (i->exactMatch)
            match = (strURI == i->prefix);
        else
            match = (strURI.substr(0, i->prefix.size()) == i->prefix);
        if (match) {
            path = strURI.substr(i->prefix.size());
            break;
        }
    }

    // Dispatch to worker thread
    if (i != iend) {
        std::unique_ptr<HTTPWorkItem> item(new HTTPWorkItem(std::move(hreq), path, i->handler));
        assert(g_work_queue);
        if (g_work_queue->Enqueue(item.get())) {
            item.release(); /* if true, queue took ownership */
        } else {
            LogPrintf("WARNING: request rejected because http work queue depth exceeded, it can be increased with the -rpcworkqueue= setting\n");
            item->req->WriteReply(HTTP_SERVICE_UNAVAILABLE, "Work queue depth exceeded");
        }
    } else {
        hreq->WriteReply(HTTP_NOT_FOUND);
    }
}